

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O3

void __thiscall xercesc_4_0::SchemaAttDef::SchemaAttDef(SchemaAttDef *this,SchemaAttDef *other)

{
  QName *pQVar1;
  QName *this_00;
  ValueVectorOf<unsigned_int> *this_01;
  
  XMLAttDef::XMLAttDef
            (&this->super_XMLAttDef,(other->super_XMLAttDef).fValue,(other->super_XMLAttDef).fType,
             (other->super_XMLAttDef).fDefaultType,(other->super_XMLAttDef).fEnumeration,
             (other->super_XMLAttDef).fMemoryManager);
  (this->super_XMLAttDef).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaAttDef_0040eed8;
  this->fElemId = 0xfffffffe;
  this->fPSVIScope = other->fPSVIScope;
  this->fAttName = (QName *)0x0;
  this->fDatatypeValidator = other->fDatatypeValidator;
  this->fNamespaceList = (ValueVectorOf<unsigned_int> *)0x0;
  this->fBaseAttDecl = other->fBaseAttDecl;
  pQVar1 = other->fAttName;
  this_00 = (QName *)XMemory::operator_new(0x48,(this->super_XMLAttDef).fMemoryManager);
  QName::QName(this_00,pQVar1->fPrefix,pQVar1->fLocalPart,pQVar1->fURIId,
               (this->super_XMLAttDef).fMemoryManager);
  this->fAttName = this_00;
  if ((other->fNamespaceList != (ValueVectorOf<unsigned_int> *)0x0) &&
     (other->fNamespaceList->fCurCount != 0)) {
    this_01 = (ValueVectorOf<unsigned_int> *)
              XMemory::operator_new(0x28,(this->super_XMLAttDef).fMemoryManager);
    ValueVectorOf<unsigned_int>::ValueVectorOf(this_01,other->fNamespaceList);
    this->fNamespaceList = this_01;
  }
  return;
}

Assistant:

SchemaAttDef::SchemaAttDef(const SchemaAttDef* other) :

    XMLAttDef(other->getValue(), other->getType(),
              other->getDefaultType(), other->getEnumeration(),
              other->getMemoryManager())
    , fElemId(XMLElementDecl::fgInvalidElemId)
    , fPSVIScope(other->fPSVIScope)
    , fAttName(0)
    , fDatatypeValidator(other->fDatatypeValidator)
    , fNamespaceList(0)
    , fBaseAttDecl(other->fBaseAttDecl)
{
    QName* otherName = other->getAttName();
    fAttName = new (getMemoryManager()) QName(otherName->getPrefix(),
                         otherName->getLocalPart(), otherName->getURI(),
                         getMemoryManager());

    if (other->fNamespaceList && other->fNamespaceList->size()) {
        fNamespaceList = new (getMemoryManager()) ValueVectorOf<unsigned int>(*(other->fNamespaceList));
    }
}